

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O0

void __thiscall wallet::RecordsPage::Unserialize<AutoFile>(RecordsPage *this,AutoFile *s)

{
  runtime_error *prVar1;
  AutoFile *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int64_t in_stack_00000008;
  int64_t to_jump;
  uint32_t i;
  int64_t pos;
  OverflowRecord record_1;
  DataRecord record;
  RecordHeader rec_hdr;
  uint16_t index;
  undefined6 in_stack_ffffffffffffff48;
  uint16_t in_stack_ffffffffffffff4e;
  DataRecord *in_stack_ffffffffffffff50;
  AutoFile *in_stack_ffffffffffffff58;
  DataRecord *in_stack_ffffffffffffff60;
  vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
  *this_00;
  uint local_5c;
  long local_58;
  int in_stack_ffffffffffffffc4;
  AutoFile *in_stack_ffffffffffffffc8;
  DataRecord local_30;
  char local_e;
  uint16_t local_a;
  pointer local_8;
  
  local_8 = *(pointer *)(in_FS_OFFSET + 0x28);
  local_58 = 0x1a;
  local_5c = 0;
  do {
    if (*(ushort *)(in_RDI + 0x14) <= local_5c) {
      if (*(pointer *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
LAB_003896ea:
      __stack_chk_fail();
    }
    AutoFile::operator>>(in_stack_ffffffffffffff58,(unsigned_short *)in_stack_ffffffffffffff50);
    if ((*(byte *)(in_RDI + 0x20) & 1) != 0) {
      local_a = internal_bswap_16(in_stack_ffffffffffffff4e);
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_ffffffffffffff58,
               (value_type_conflict6 *)in_stack_ffffffffffffff50);
    local_58 = local_58 + 2;
    if ((long)((ulong)local_a - local_58) < 0) {
      prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar1,"Data record position not in page");
      if (*(pointer *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_003896ea;
    }
    AutoFile::ignore(in_RSI,(ulong)local_a - local_58);
    this_00 = (vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
               *)&stack0xfffffffffffffff0;
    RecordHeader::RecordHeader
              ((RecordHeader *)CONCAT26(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48),false);
    AutoFile::operator>>(in_stack_ffffffffffffff58,&in_stack_ffffffffffffff50->m_header);
    if (local_e == '\x01') {
      in_stack_ffffffffffffff60 = &local_30;
      DataRecord::DataRecord
                ((DataRecord *)CONCAT26(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48),
                 (RecordHeader *)0x389552);
      AutoFile::operator>>(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      std::
      vector<std::variant<wallet::DataRecord,wallet::OverflowRecord>,std::allocator<std::variant<wallet::DataRecord,wallet::OverflowRecord>>>
      ::emplace_back<wallet::DataRecord&>(this_00,in_stack_ffffffffffffff60);
      DataRecord::~DataRecord
                ((DataRecord *)CONCAT26(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48));
    }
    else {
      if (local_e != '\x03') {
        prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar1,"Unknown record type in records page");
        if (*(pointer *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_003896ea;
      }
      OverflowRecord::OverflowRecord
                ((OverflowRecord *)CONCAT26(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48),
                 (RecordHeader *)0x3895d5);
      AutoFile::operator>>(in_stack_ffffffffffffff58,(OverflowRecord *)in_stack_ffffffffffffff50);
      std::
      vector<std::variant<wallet::DataRecord,wallet::OverflowRecord>,std::allocator<std::variant<wallet::DataRecord,wallet::OverflowRecord>>>
      ::emplace_back<wallet::OverflowRecord&>(this_00,(OverflowRecord *)in_stack_ffffffffffffff60);
    }
    AutoFile::seek(in_stack_ffffffffffffffc8,in_stack_00000008,in_stack_ffffffffffffffc4);
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

void Unserialize(Stream& s)
    {
        // Current position within the page
        int64_t pos = PageHeader::SIZE;

        // Get the items
        for (uint32_t i = 0; i < m_header.entries; ++i) {
            // Get the index
            uint16_t index;
            s >> index;
            if (m_header.other_endian) {
                index = internal_bswap_16(index);
            }
            indexes.push_back(index);
            pos += sizeof(uint16_t);

            // Go to the offset from the index
            int64_t to_jump = index - pos;
            if (to_jump < 0) {
                throw std::runtime_error("Data record position not in page");
            }
            s.ignore(to_jump);

            // Read the record
            RecordHeader rec_hdr(m_header.other_endian);
            s >> rec_hdr;
            to_jump += RecordHeader::SIZE;

            switch (rec_hdr.type) {
            case RecordType::KEYDATA: {
                DataRecord record(rec_hdr);
                s >> record;
                records.emplace_back(record);
                to_jump += rec_hdr.len;
                break;
            }
            case RecordType::OVERFLOW_DATA: {
                OverflowRecord record(rec_hdr);
                s >> record;
                records.emplace_back(record);
                to_jump += OverflowRecord::SIZE;
                break;
            }
            default:
                throw std::runtime_error("Unknown record type in records page");
            }

            // Go back to the indexes
            s.seek(-to_jump, SEEK_CUR);
        }
    }